

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O0

void tcmalloc::ThreadCache::DeleteCache(ThreadCache *heap)

{
  SpinLock *l;
  SpinLockHolder local_18;
  SpinLockHolder h;
  ThreadCache *heap_local;
  
  h.lock_ = (SpinLock *)heap;
  ~ThreadCache(heap);
  l = Static::pageheap_lock();
  SpinLockHolder::SpinLockHolder(&local_18,l);
  if (*(long *)(h.lock_ + 0x408) != 0) {
    *(undefined8 *)(*(long *)(h.lock_ + 0x408) + 0x1028) = *(undefined8 *)(h.lock_ + 0x40a);
  }
  if (*(long *)(h.lock_ + 0x40a) != 0) {
    *(undefined8 *)(*(long *)(h.lock_ + 0x40a) + 0x1020) = *(undefined8 *)(h.lock_ + 0x408);
  }
  if (thread_heaps_ == h.lock_) {
    thread_heaps_ = *(SpinLock **)(h.lock_ + 0x408);
  }
  thread_heap_count_ = thread_heap_count_ + -1;
  if (next_memory_steal_ == h.lock_) {
    next_memory_steal_ = *(SpinLock **)(h.lock_ + 0x408);
  }
  if (next_memory_steal_ == (SpinLock *)0x0) {
    next_memory_steal_ = thread_heaps_;
  }
  unclaimed_cache_space_ =
       unclaimed_cache_space_ + h.lock_[0x401].lockword_.super___atomic_base<int>._M_i;
  PageHeapAllocator<tcmalloc::ThreadCache>::Delete
            ((PageHeapAllocator<tcmalloc::ThreadCache> *)threadcache_allocator,
             (ThreadCache *)h.lock_);
  SpinLockHolder::~SpinLockHolder(&local_18);
  return;
}

Assistant:

void ThreadCache::DeleteCache(ThreadCache* heap) {
  // Remove all memory from heap
  heap->~ThreadCache();

  // Remove from linked list
  SpinLockHolder h(Static::pageheap_lock());
  if (heap->next_ != nullptr) heap->next_->prev_ = heap->prev_;
  if (heap->prev_ != nullptr) heap->prev_->next_ = heap->next_;
  if (thread_heaps_ == heap) thread_heaps_ = heap->next_;
  thread_heap_count_--;

  if (next_memory_steal_ == heap) next_memory_steal_ = heap->next_;
  if (next_memory_steal_ == nullptr) next_memory_steal_ = thread_heaps_;
  unclaimed_cache_space_ += heap->max_size_;

  threadcache_allocator.Delete(heap);
}